

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.cpp
# Opt level: O1

void __thiscall
CubicInterpolation::interpolation
          (CubicInterpolation *this,PointType *p1,double theta1,PointType *p2,double theta2)

{
  double dVar1;
  double dVar2;
  SrcEvaluatorType srcEvaluator;
  double dVar3;
  double dVar4;
  double dVar5;
  double ks1;
  double local_58;
  double local_50;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_48;
  
  dVar4 = (p2->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0] - (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                array[0];
  dVar5 = (p2->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1] - (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                array[1];
  dVar3 = SQRT(dVar5 * dVar5 + dVar4 * dVar4);
  dVar4 = cos(theta1);
  dVar4 = dVar4 * dVar3;
  local_58 = sin(theta1);
  local_58 = local_58 * dVar3;
  dVar5 = cos(theta2);
  dVar1 = sin(theta2);
  dVar2 = (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  this->coeffs_[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[0];
  this->coeffs_[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = dVar2;
  local_48.m_xpr = this->coeffs_ + 1;
  local_48.m_row = 0;
  local_48.m_col = 1;
  local_48.m_currentBlockRows = 1;
  this->coeffs_[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = dVar4;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_48,&local_58);
  if ((local_48.m_currentBlockRows + local_48.m_row == 2) && (local_48.m_col == 1)) {
    local_48.m_xpr = this->coeffs_ + 2;
    local_48.m_row = 0;
    local_48.m_col = 1;
    local_48.m_currentBlockRows = 1;
    this->coeffs_[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
    array[0] = (((p2->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                 .array[0] -
                (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                array[0]) * 3.0 - (dVar4 + dVar4)) - dVar5 * dVar3;
    local_50 = (((p2->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                 .array[1] -
                (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                array[1]) * 3.0 - (local_58 + local_58)) - dVar1 * dVar3;
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_48,&local_50);
    if ((local_48.m_currentBlockRows + local_48.m_row == 2) && (local_48.m_col == 1)) {
      dVar2 = (p2->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[0] -
              (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[0];
      local_48.m_xpr = this->coeffs_ + 3;
      local_48.m_row = 0;
      local_48.m_col = 1;
      local_48.m_currentBlockRows = 1;
      this->coeffs_[3].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
      .array[0] = dVar5 * dVar3 + (dVar4 - (dVar2 + dVar2));
      dVar4 = (p2->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[1] -
              (p1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[1];
      local_50 = dVar1 * dVar3 + (local_58 - (dVar4 + dVar4));
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_48,&local_50)
      ;
      if ((local_48.m_currentBlockRows + local_48.m_row == 2) && (local_48.m_col == 1)) {
        (**(this->super_Curve<3,_2>)._vptr_Curve)(this);
        return;
      }
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
               );
}

Assistant:

void CubicInterpolation::interpolation(const PointType& p1,
                                       double theta1,
                                       const PointType& p2,
                                       double theta2) {
  auto dp = p2 - p1;

  double k = dp.norm();

  double kc1 = k * cos(theta1);
  double ks1 = k * sin(theta1);
  double kc2 = k * cos(theta2);
  double ks2 = k * sin(theta2);

  coeffs_[0] = p1;
  coeffs_[1] << kc1, ks1;
  coeffs_[2] << 3.0 * dp(0) - 2.0 * kc1 - kc2, 3.0 * dp(1) - 2.0 * ks1 - ks2;

  coeffs_[3] << -2.0 * dp(0) + kc1 + kc2, -2.0 * dp(1) + ks1 + ks2;

  computeLength();
}